

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

void __thiscall DnsStats::~DnsStats(DnsStats *this)

{
  BinHash<TldAsKey> *pBVar1;
  
  BinHash<DnsNameEntry>::Clear(&this->nameList);
  BinHash<StatsByIP>::Clear(&this->statsByIp);
  BinHash<DnssecPrefixEntry>::Clear(&this->dnssecPrefixTable);
  BinHash<DnsPrefixEntry>::Clear(&this->dnsPrefixTable);
  pBVar1 = &(this->tldStringUsage).binHash;
  BinHash<TldAsKey>::Clear(pBVar1);
  (this->tldStringUsage).MostRecentlyUsed = (TldAsKey *)0x0;
  (this->tldStringUsage).LeastRecentlyUsed = (TldAsKey *)0x0;
  BinHash<TldAsKey>::Clear(pBVar1);
  BinHash<TldAsKey>::Clear(&this->registeredTld);
  BinHash<TldAddressAsKey>::Clear(&this->queryUsage);
  pBVar1 = &(this->secondLdLeakage).binHash;
  BinHash<TldAsKey>::Clear(pBVar1);
  (this->secondLdLeakage).MostRecentlyUsed = (TldAsKey *)0x0;
  (this->secondLdLeakage).LeastRecentlyUsed = (TldAsKey *)0x0;
  BinHash<TldAsKey>::Clear(pBVar1);
  pBVar1 = &(this->tldLeakage).binHash;
  BinHash<TldAsKey>::Clear(pBVar1);
  (this->tldLeakage).MostRecentlyUsed = (TldAsKey *)0x0;
  (this->tldLeakage).LeastRecentlyUsed = (TldAsKey *)0x0;
  BinHash<TldAsKey>::Clear(pBVar1);
  AddressUseTracker::~AddressUseTracker(&this->frequentAddresses);
  AddressFilter::~AddressFilter(&this->bannedAddresses);
  AddressFilter::~AddressFilter(&this->allowedAddresses);
  AddressFilter::~AddressFilter(&this->rootAddresses);
  BinHash<DnsHashEntry>::Clear(&this->hashTable);
  return;
}

Assistant:

DnsStats::~DnsStats()
{
}